

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O2

void bench_interpolate_step
               (vector<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*),_std::allocator<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*)>_>
                *functions,fasthessian *fh,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  response_layer *bottom;
  response_layer *middle;
  response_layer *top;
  bool bVar1;
  long lVar2;
  int r;
  int row;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int c;
  int col;
  int local_58;
  int local_54;
  
  for (uVar5 = 0; uVar5 < (ulong)(*(long *)(functions + 8) - *(long *)functions >> 3);
      uVar5 = uVar5 + 1) {
    iVar6 = 1;
    for (local_54 = 0; local_54 < fh->octaves; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
        lVar2 = (long)local_54;
        bottom = fh->response_map[(int)(&DAT_001601d0)[lVar2 * 4 + (long)local_58]];
        middle = fh->response_map[(int)(&DAT_001601d4)[lVar2 * 4 + (long)local_58]];
        top = fh->response_map[(int)(&DAT_001601d8)[lVar2 * 4 + (long)local_58]];
        for (row = 0; row < top->height; row = row + 1) {
          col = 0;
          while( true ) {
            if (top->width <= col) break;
            bVar1 = is_extremum(row,col,top,middle,bottom,fh->thresh);
            if (bVar1) {
              perf_interpolate_step
                        (*(_func_void_int_int_response_layer_ptr_response_layer_ptr_response_layer_ptr_float_ptr
                           **)(*(long *)functions + uVar5 * 8),row,col,top,middle,bottom,
                         (benchmark_data *)(uVar5 * 0x238 + *(long *)data));
              iVar6 = iVar6 + 1;
              if (iVar6 == 4) {
                col = top->width;
                row = top->height;
                local_54 = fh->octaves;
                iVar6 = 4;
                local_58 = 2;
              }
            }
            col = col + 1;
          }
        }
      }
    }
    uVar3 = (ulong)iVar6;
    lVar2 = *(long *)data;
    lVar4 = uVar5 * 0x238;
    *(ulong *)(lVar2 + 0x218 + lVar4) = *(ulong *)(lVar2 + 0x218 + lVar4) / uVar3;
    *(ulong *)(lVar2 + 0x228 + lVar4) = *(ulong *)(lVar2 + 0x228 + lVar4) / uVar3;
    *(ulong *)(lVar2 + 0x220 + lVar4) = *(ulong *)(lVar2 + 0x220 + lVar4) / uVar3;
    *(double *)(lVar2 + 0x230 + lVar4) = *(double *)(lVar2 + 0x230 + lVar4) / (double)iVar6;
  }
  return;
}

Assistant:

void bench_interpolate_step(const std::vector<void (*)(int, int, struct response_layer *, struct response_layer *, struct response_layer *, float[3])> &functions, 
                            struct fasthessian *fh, 
                            std::vector<struct benchmark_data> &data) {
    
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {

        int counter = 1;
        // Specifies how many times the benchmarikng for interpolate_step is called.
        // The average of the outcome will be taken
        int limit = 4;

        assert(fh != NULL);

        // filter index map
        const int filter_map[NUM_OCTAVES][NUM_LAYERS] = {
            {0, 1, 2, 3}, 
            {1, 3, 4, 5}, 
            {3, 5, 6, 7},
            //{5, 7, 8, 9},
            //{7, 9, 10, 11}
        };

        // getting response layers
        struct response_layer *bottom;
        struct response_layer *middle;
        struct response_layer *top;

        // iterating through all octaves and each layer of octave in window of three (top, middle, bottom)
        for (int o = 0; o < fh->octaves; ++o) {
            // TODO: (Sebastian) allow for fh->layers != 4 as well (note that fh->layers>=3 has to hold)
            for (int i = 0; i <= 1; ++i) {
                // assigning respective bottom, middle and top response layer
                bottom = fh->response_map[filter_map[o][i]];
                middle = fh->response_map[filter_map[o][i + 1]];
                top = fh->response_map[filter_map[o][i + 2]];

                // iterating over middle response layer at density of the most sparse layer (always top),
                // to find maxima accreoss scale and space
                for (int r = 0; r < top->height; ++r) {
                    for (int c = 0; c < top->width; ++c) {
                        // checking if current pixel position is local maximum in 3x3x3 maximum and above threshold
                        if (is_extremum(r, c, top, middle, bottom, fh->thresh)) {
                            perf_interpolate_step(functions[j], r, c, top, middle, bottom, data[j]);
                            counter++;
                            if (counter == limit) {
                                c = top->width;
                                r = top->height;
                                i = 2;
                                o = fh->octaves;
                            }
                        }
                    }
                }
            }
        }

        data[j].avg_cycles /= counter;
        data[j].max_cycles /= counter;
        data[j].min_cycles /= counter;
        data[j].flops_per_cycle /= counter;

    }

}